

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

vec3 polyscope::view::getFrontVec(void)

{
  vec3 vVar1;
  undefined8 local_c;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_4;
  
  switch(frontDir) {
  case 0:
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_c,1.0,0.0,0.0);
    break;
  case 1:
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_c,0.0,1.0,0.0);
    break;
  case 2:
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_c,0.0,0.0,1.0);
    break;
  case 3:
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_c,-1.0,0.0,0.0);
    break;
  case 4:
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_c,0.0,-1.0,0.0);
    break;
  case 5:
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_c,0.0,0.0,-1.0);
    break;
  default:
    glm::vec<3,float,(glm::qualifier)0>::vec<double,double,double>
              ((vec<3,float,(glm::qualifier)0> *)&local_c,0.0,0.0,0.0);
  }
  vVar1.field_2 = local_4;
  vVar1.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_c;
  vVar1.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_c._4_4_;
  return vVar1;
}

Assistant:

glm::vec3 getFrontVec() {
  switch (frontDir) {
  case FrontDir::NegXFront:
    return glm::vec3{-1., 0., 0.};
  case FrontDir::XFront:
    return glm::vec3{1., 0., 0.};
  case FrontDir::NegYFront:
    return glm::vec3{0., -1., 0.};
  case FrontDir::YFront:
    return glm::vec3{0., 1., 0.};
  case FrontDir::NegZFront:
    return glm::vec3{0., 0., -1.};
  case FrontDir::ZFront:
    return glm::vec3{0., 0., 1.};
  }

  // unused fallthrough
  return glm::vec3{0., 0., 0.};
}